

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

Tool * __thiscall
anon_unknown.dwarf_f615c::BuildFileImpl::getOrCreateTool
          (BuildFileImpl *this,StringRef name,Node *forNode)

{
  StringRef Key;
  iterator node;
  bool bVar1;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
  *pSVar2;
  undefined8 uVar3;
  pointer pTVar4;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *this_00;
  pointer result;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  StringRef local_88;
  BuildFileImpl *local_78;
  char *local_70;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> local_68;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> tool;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
  local_48;
  iterator it;
  Node *forNode_local;
  BuildFileImpl *this_local;
  StringRef name_local;
  
  name_local.Data = (char *)name.Length;
  this_local = (BuildFileImpl *)name.Data;
  it.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
          )(StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
            )forNode;
  local_48.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
                 ::find(&this->tools,name);
  tool._M_t.
  super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl =
       (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
        )llvm::
         StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
         ::end(&this->tools);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
                        *)&local_48,
                       (StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
                        *)&tool);
  if (bVar1) {
    pSVar2 = llvm::
             iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
             ::operator->((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
                           *)&local_48);
    name_local.Length =
         (size_t)std::
                 unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
                 ::get(&pSVar2->second);
  }
  else {
    local_78 = this_local;
    local_70 = name_local.Data;
    (*this->delegate->_vptr_BuildFileDelegate[8])
              (&local_68,this->delegate,this_local,name_local.Data);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
    node = it;
    if (bVar1) {
      pTVar4 = std::
               unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
               ::get(&local_68);
      Key.Length = (size_t)name_local.Data;
      Key.Data = (char *)this_local;
      this_00 = llvm::
                StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
                ::operator[](&this->tools,Key);
      std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
      ::operator=(this_00,&local_68);
      name_local.Length = (size_t)pTVar4;
    }
    else {
      llvm::StringRef::str_abi_cxx11_(&local_e8,(StringRef *)&this_local);
      std::operator+(&local_c8,"invalid tool (",&local_e8);
      std::operator+(&local_a8,&local_c8,") type in \'tools\' map");
      uVar3 = std::__cxx11::string::data();
      local_88.Data = (char *)uVar3;
      uVar3 = std::__cxx11::string::length();
      local_88.Length = uVar3;
      error(this,(Node *)node.
                         super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                         .Ptr,local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      name_local.Length = 0;
    }
    std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>::
    ~unique_ptr(&local_68);
  }
  return (Tool *)name_local.Length;
}

Assistant:

Tool* getOrCreateTool(StringRef name, llvm::yaml::Node* forNode) {
    // First, check the map.
    auto it = tools.find(name);
    if (it != tools.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the tool.
    auto tool = delegate.lookupTool(name);
    if (!tool) {
      error(forNode, "invalid tool (" + name.str() +") type in 'tools' map");
      return nullptr;
    }
    auto result = tool.get();
    tools[name] = std::move(tool);

    return result;
  }